

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapping0.c
# Opt level: O2

vorbis_info_mapping * mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb)

{
  void *pvVar1;
  int iVar2;
  uint uVar3;
  uint *i;
  long lVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  
  i = (uint *)calloc(1,0xc88);
  if (0 < vi->channels) {
    pvVar1 = vi->codec_setup;
    uVar7 = 1;
    lVar4 = oggpack_read(opb,1);
    if (-1 < (int)lVar4) {
      if ((int)lVar4 == 0) {
        *i = 1;
      }
      else {
        lVar4 = oggpack_read(opb,4);
        uVar7 = (uint)lVar4 + 1;
        *i = uVar7;
        if (0x7ffffffe < (uint)lVar4) goto LAB_001c2788;
      }
      lVar4 = oggpack_read(opb,1);
      if (-1 < (int)lVar4) {
        if ((int)lVar4 == 0) {
LAB_001c2778:
          lVar4 = oggpack_read(opb,2);
          if (lVar4 == 0) {
            if ((int)uVar7 < 2) {
LAB_001c27d2:
              lVar4 = 0;
              while( true ) {
                if ((int)uVar7 <= lVar4) {
                  return i;
                }
                oggpack_read(opb,8);
                lVar5 = oggpack_read(opb,8);
                uVar6 = (uint)lVar5;
                i[lVar4 + 0x101] = uVar6;
                if (((int)uVar6 < 0) || (*(int *)((long)pvVar1 + 0x18) <= (int)uVar6)) break;
                lVar5 = oggpack_read(opb,8);
                uVar6 = (uint)lVar5;
                i[lVar4 + 0x111] = uVar6;
                if (((int)uVar6 < 0) ||
                   (lVar4 = lVar4 + 1, *(int *)((long)pvVar1 + 0x1c) <= (int)uVar6)) break;
              }
            }
            else {
              lVar4 = 0;
              do {
                if (vi->channels <= lVar4) goto LAB_001c27d2;
                lVar5 = oggpack_read(opb,4);
                i[lVar4 + 1] = (uint)lVar5;
                lVar4 = lVar4 + 1;
              } while ((uint)lVar5 < uVar7);
            }
          }
        }
        else {
          lVar4 = oggpack_read(opb,8);
          uVar6 = (uint)lVar4 + 1;
          i[0x121] = uVar6;
          if ((uint)lVar4 < 0x7fffffff) {
            lVar4 = 0;
            do {
              if ((int)uVar6 <= lVar4) goto LAB_001c2778;
              iVar2 = ov_ilog(vi->channels - 1);
              lVar5 = oggpack_read(opb,iVar2);
              uVar8 = (uint)lVar5;
              i[lVar4 + 0x122] = uVar8;
              iVar2 = ov_ilog(vi->channels - 1);
              lVar5 = oggpack_read(opb,iVar2);
              uVar3 = (uint)lVar5;
              i[lVar4 + 0x222] = uVar3;
            } while ((((-1 < (int)uVar8) && (-1 < (int)uVar3)) && (uVar8 != uVar3)) &&
                    (((int)uVar8 < vi->channels && (lVar4 = lVar4 + 1, (int)uVar3 < vi->channels))))
            ;
          }
        }
      }
    }
  }
LAB_001c2788:
  mapping0_free_info(i);
  return (vorbis_info_mapping *)0x0;
}

Assistant:

static vorbis_info_mapping *mapping0_unpack(vorbis_info *vi,oggpack_buffer *opb){
  int i,b;
  vorbis_info_mapping0 *info=_ogg_calloc(1,sizeof(*info));
  codec_setup_info     *ci=vi->codec_setup;
  if(vi->channels<=0)goto err_out;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->submaps=oggpack_read(opb,4)+1;
    if(info->submaps<=0)goto err_out;
  }else
    info->submaps=1;

  b=oggpack_read(opb,1);
  if(b<0)goto err_out;
  if(b){
    info->coupling_steps=oggpack_read(opb,8)+1;
    if(info->coupling_steps<=0)goto err_out;
    for(i=0;i<info->coupling_steps;i++){
      /* vi->channels > 0 is enforced in the caller */
      int testM=info->coupling_mag[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));
      int testA=info->coupling_ang[i]=
        oggpack_read(opb,ov_ilog(vi->channels-1));

      if(testM<0 ||
         testA<0 ||
         testM==testA ||
         testM>=vi->channels ||
         testA>=vi->channels) goto err_out;
    }

  }

  if(oggpack_read(opb,2)!=0)goto err_out; /* 2,3:reserved */

  if(info->submaps>1){
    for(i=0;i<vi->channels;i++){
      info->chmuxlist[i]=oggpack_read(opb,4);
      if(info->chmuxlist[i]>=info->submaps || info->chmuxlist[i]<0)goto err_out;
    }
  }
  for(i=0;i<info->submaps;i++){
    oggpack_read(opb,8); /* time submap unused */
    info->floorsubmap[i]=oggpack_read(opb,8);
    if(info->floorsubmap[i]>=ci->floors || info->floorsubmap[i]<0)goto err_out;
    info->residuesubmap[i]=oggpack_read(opb,8);
    if(info->residuesubmap[i]>=ci->residues || info->residuesubmap[i]<0)goto err_out;
  }

  return info;

 err_out:
  mapping0_free_info(info);
  return(NULL);
}